

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O2

void __thiscall
Diligent::RefCountersImpl::
ObjectWrapper<Diligent::TextureViewVkImpl,_Diligent::FixedBlockMemoryAllocator>::DestroyObject
          (ObjectWrapper<Diligent::TextureViewVkImpl,_Diligent::FixedBlockMemoryAllocator> *this)

{
  TextureViewVkImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this->m_pAllocator != (FixedBlockMemoryAllocator *)0x0) {
    TextureViewVkImpl::~TextureViewVkImpl(this_00);
    FixedBlockMemoryAllocator::Free(this->m_pAllocator,this->m_pObject);
    return;
  }
  if (this_00 != (TextureViewVkImpl *)0x0) {
    TextureViewVkImpl::~TextureViewVkImpl(this_00);
  }
  free(this_00);
  return;
}

Assistant:

virtual void DestroyObject() override final
        {
            if (m_pAllocator)
            {
                m_pObject->~ObjectType();
                m_pAllocator->Free(m_pObject);
            }
            else
            {
                delete m_pObject;
            }
        }